

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O0

void RigidBodyDynamics::NonlinearEffects
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  Scalar *pSVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  Scalar *pSVar8;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_R8;
  ReturnType RVar9;
  uint k;
  uint i_2;
  uint i_1;
  uint i;
  SpatialVector spatial_gravity;
  VectorNd *in_stack_00000840;
  VectorNd *in_stack_00000848;
  uint in_stack_00000854;
  Model *in_stack_00000858;
  Index in_stack_fffffffffffffa98;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *this;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffaa0;
  reference in_stack_fffffffffffffaa8;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffab0;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *in_stack_fffffffffffffab8;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffac0;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffac8;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffad0;
  reference in_stack_fffffffffffffad8;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffae0;
  double *in_stack_fffffffffffffaf8;
  double *in_stack_fffffffffffffb00;
  double *in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  bool bVar10;
  double *in_stack_fffffffffffffb18;
  pointer *this_01;
  SpatialVector_t *in_stack_fffffffffffffb20;
  double *in_stack_fffffffffffffb30;
  SpatialVector *in_stack_fffffffffffffbd0;
  SpatialVector *in_stack_fffffffffffffbd8;
  uint local_3ac;
  SpatialVector *in_stack_fffffffffffffc60;
  SpatialTransform *in_stack_fffffffffffffc68;
  SpatialTransform *in_stack_fffffffffffffc90;
  SpatialVector *in_stack_fffffffffffffcc0;
  SpatialRigidBodyInertia *in_stack_fffffffffffffcc8;
  uint local_90;
  uint local_8c;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *local_28;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  local_60 = 0;
  local_68 = 0;
  local_70 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  local_78 = -*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  local_80 = -*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  local_88 = -*pSVar3;
  this = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          *)&local_88;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             (double *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
             in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             in_stack_fffffffffffffb30);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_stack_fffffffffffffaa0);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffaa0,(SpatialVector_t *)this);
  for (local_8c = 1;
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &local_8[0xb].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), local_8c < sVar4;
      local_8c = local_8c + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &local_8[0xb].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(ulong)local_8c);
    jcalc(in_stack_00000858,in_stack_00000854,in_stack_00000848,in_stack_00000840);
  }
  for (local_90 = 1;
      sVar4 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish), local_90 < sVar4;
      local_90 = local_90 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_8,(ulong)local_90);
    if (*pvVar5 == 0) {
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffaa0,(SpatialVector_t *)this);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x1f),(ulong)local_90);
      Math::SpatialTransform::apply(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffaa0,(SpatialVector_t *)this);
    }
    else {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x1f),(ulong)local_90);
      this_01 = &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)this_01,
                 (ulong)*pvVar5);
      Math::SpatialTransform::apply(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffaa0,this);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Math::crossm(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffaa0,this);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x1f),(ulong)local_90);
      pvVar2 = local_8 + 5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)*pvVar5);
      Math::SpatialTransform::apply(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffaa0,this);
    }
    pvVar6 = std::
             vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
             operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         *)&local_8[0x22].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish,(ulong)local_90);
    if ((pvVar6->mIsVirtual & 1U) == 0) {
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(local_8 + 0x1b),(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(local_8 + 0x1b),(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      Math::crossf(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x1a),(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffaa0,this);
      bVar10 = false;
      if (local_28 != (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)0x0) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  (local_28,(ulong)local_90);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
        bVar10 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator!=
                           (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      }
      if (bVar10 != false) {
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x20),(ulong)local_90);
        Math::SpatialTransform::toMatrixAdjoint(in_stack_fffffffffffffc90);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  (local_28,(ulong)local_90);
        Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_fffffffffffffaa0,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_8 + 0x1a),(ulong)local_90);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-=
                  (in_stack_fffffffffffffac0,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)in_stack_fffffffffffffab8);
      }
    }
    else {
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x1a),(ulong)local_90);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_stack_fffffffffffffaa0);
    }
  }
  sVar4 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)&local_8[0x22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
  local_3ac = (uint)sVar4;
  while (local_3ac = local_3ac - 1, local_3ac != 0) {
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac);
    if (pvVar7->mJointType == JointTypeCustom) {
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&local_8[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac);
      if (pvVar7->mJointType == JointTypeCustom) {
        pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac
                             );
        uVar1 = pvVar7->custom_joint_index;
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_8 + 0x1a),(ulong)local_3ac);
        Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                  ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                   in_stack_fffffffffffffaa0,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
        in_stack_fffffffffffffac0 = local_20;
        pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac
                             );
        in_stack_fffffffffffffac8 =
             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(ulong)pvVar7->q_index;
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&local_8[0x13].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
        Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<unsigned_int,int>
                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffae0,
                   (Index)in_stack_fffffffffffffad8,(Index)in_stack_fffffffffffffad0,
                   (uint)((ulong)in_stack_fffffffffffffac8 >> 0x20),(int)in_stack_fffffffffffffac8);
        Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)
                   in_stack_fffffffffffffaa0,
                   (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)this);
      }
    }
    else {
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&local_8[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac);
      if (pvVar7->mDoFCount == 1) {
        in_stack_fffffffffffffad8 =
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        &local_8[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (local_8 + 0x1a),(ulong)local_3ac);
        RVar9 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
                dot<Eigen::Matrix<double,6,1,0,6,1>>
                          ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                           in_stack_fffffffffffffaa0,
                           (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
        in_stack_fffffffffffffae0 = local_20;
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)&local_8[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac);
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_fffffffffffffaa0,(Index)this);
        *pSVar8 = RVar9;
      }
      else {
        pvVar7 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&local_8[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac
                             );
        if (pvVar7->mDoFCount == 3) {
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&local_8[0xe].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac);
          Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)this);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     (local_8 + 0x1a),(ulong)local_3ac);
          Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                     in_stack_fffffffffffffaa0,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
          in_stack_fffffffffffffad0 = local_20;
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)&local_8[6].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_3ac);
          Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
                    (in_stack_fffffffffffffab0,(Index)in_stack_fffffffffffffaa8,
                     (Index)in_stack_fffffffffffffaa0);
          Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
                    ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)
                     in_stack_fffffffffffffaa0,
                     (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)this);
        }
      }
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_8,(ulong)local_3ac);
    if (*pvVar5 != 0) {
      in_stack_fffffffffffffaa0 =
           (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(local_8 + 0x1a);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_3ac);
      in_stack_fffffffffffffab0 =
           (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      in_stack_fffffffffffffaa0,(ulong)*pvVar5);
      in_stack_fffffffffffffaa8 =
           std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)(local_8 + 0x1f),(ulong)local_3ac);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x1a),(ulong)local_3ac);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      this_00 = (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                (local_8 + 0x1a);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_3ac);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                (this_00,(ulong)*pvVar5);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffaa0,this);
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void NonlinearEffects ( 
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    VectorNd &Tau,
    std::vector<Math::SpatialVector> *f_ext) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  SpatialVector spatial_gravity (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0] = spatial_gravity;

  for (unsigned int i = 1; i < model.mJointUpdateOrder.size(); i++) {
    jcalc (model, model.mJointUpdateOrder[i], Q, QDot);
  }

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (model.lambda[i] == 0) {
      model.v[i] = model.v_J[i];
      model.a[i] = model.X_lambda[i].apply(spatial_gravity);
    }	else {
      model.v[i] = model.X_lambda[i].apply(model.v[model.lambda[i]]) + model.v_J[i];
      model.c[i] = model.c_J[i] + crossm(model.v[i],model.v_J[i]);
      model.a[i] = model.X_lambda[i].apply(model.a[model.lambda[i]]) + model.c[i];
    }

    if (!model.mBodies[i].mIsVirtual) {
      model.f[i] = model.I[i] * model.a[i] + crossf(model.v[i],model.I[i] * model.v[i]);
#ifdef RBDL_USE_CASADI_MATH
      if (f_ext != NULL)
#else
      if (f_ext != NULL && (*f_ext)[i] != SpatialVector::Zero())
#endif
      {
        model.f[i] -= model.X_base[i].toMatrixAdjoint() * (*f_ext)[i];
      }            
    } else {
      model.f[i].setZero();
    }
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if(model.mJoints[i].mJointType != JointTypeCustom){
      if (model.mJoints[i].mDoFCount == 1) {
        Tau[model.mJoints[i].q_index]
          = model.S[i].dot(model.f[i]);
      } else if (model.mJoints[i].mDoFCount == 3) {
        Tau.block<3,1>(model.mJoints[i].q_index, 0)
          = model.multdof3_S[i].transpose() * model.f[i];
      }
    } else if(model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int k = model.mJoints[i].custom_joint_index;
      Tau.block(model.mJoints[i].q_index,0,
          model.mCustomJoints[k]->mDoFCount, 1)
        = model.mCustomJoints[k]->S.transpose() * model.f[i];
    }

    if (model.lambda[i] != 0) {
      model.f[model.lambda[i]] = model.f[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.f[i]);
    }
  }
}